

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

void vkt::SpirVAssembly::createUConvertCases
               (vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
                *testCases)

{
  deInt32 *pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ConvertCase CStack_98;
  
  ConvertCase::ConvertCase(&CStack_98,INTEGER_TYPE_UNSIGNED_16,INTEGER_TYPE_UNSIGNED_32,0xeced);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&CStack_98);
  if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_outputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_outputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_inputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_inputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&CStack_98.m_asmTypes._M_t);
  paVar2 = &CStack_98.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CStack_98.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(CStack_98.m_name._M_dataplus._M_p,
                    CStack_98.m_name.field_2._M_allocated_capacity + 1);
  }
  ConvertCase::ConvertCase(&CStack_98,INTEGER_TYPE_UNSIGNED_16,INTEGER_TYPE_UNSIGNED_64,0x4647);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&CStack_98);
  if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_outputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_outputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_inputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_inputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&CStack_98.m_asmTypes._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CStack_98.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(CStack_98.m_name._M_dataplus._M_p,
                    CStack_98.m_name.field_2._M_allocated_capacity + 1);
  }
  ConvertCase::ConvertCase(&CStack_98,INTEGER_TYPE_UNSIGNED_32,INTEGER_TYPE_UNSIGNED_64,0x35e5db13);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&CStack_98);
  if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_outputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_outputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_inputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_inputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&CStack_98.m_asmTypes._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CStack_98.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(CStack_98.m_name._M_dataplus._M_p,
                    CStack_98.m_name.field_2._M_allocated_capacity + 1);
  }
  ConvertCase::ConvertCase(&CStack_98,INTEGER_TYPE_UNSIGNED_16,INTEGER_TYPE_SIGNED_32,0x9472);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&CStack_98);
  if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_outputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_outputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_inputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_inputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&CStack_98.m_asmTypes._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CStack_98.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(CStack_98.m_name._M_dataplus._M_p,
                    CStack_98.m_name.field_2._M_allocated_capacity + 1);
  }
  ConvertCase::ConvertCase(&CStack_98,INTEGER_TYPE_UNSIGNED_16,INTEGER_TYPE_SIGNED_64,0xfd99);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&CStack_98);
  if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_outputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_outputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_inputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_inputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&CStack_98.m_asmTypes._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CStack_98.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(CStack_98.m_name._M_dataplus._M_p,
                    CStack_98.m_name.field_2._M_allocated_capacity + 1);
  }
  ConvertCase::ConvertCase(&CStack_98,INTEGER_TYPE_UNSIGNED_32,INTEGER_TYPE_SIGNED_64,0xffffd507);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  emplace_back<vkt::SpirVAssembly::ConvertCase>(testCases,&CStack_98);
  if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_outputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_outputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_outputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_outputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_outputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      CStack_98.m_inputBuffer.m_ptr = (BufferInterface *)0x0;
      (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(CStack_98.m_inputBuffer.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (CStack_98.m_inputBuffer.m_state != (SharedPtrStateBase *)0x0) {
        (*(CStack_98.m_inputBuffer.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      CStack_98.m_inputBuffer.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&CStack_98.m_asmTypes._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CStack_98.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(CStack_98.m_name._M_dataplus._M_p,
                    CStack_98.m_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void createUConvertCases (vector<ConvertCase>& testCases)
{
	// Convert unsigned int to unsigned int
	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_16,	INTEGER_TYPE_UNSIGNED_32,	60653));
	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_16,	INTEGER_TYPE_UNSIGNED_64,	17991));

	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_32,	INTEGER_TYPE_UNSIGNED_64,	904256275));

	// Convert unsigned int to int
	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_16,	INTEGER_TYPE_SIGNED_32,		38002));
	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_16,	INTEGER_TYPE_SIGNED_64,		64921));

	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_32,	INTEGER_TYPE_SIGNED_64,		4294956295ll));
}